

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O0

string * ParamDecls_abi_cxx11_(ParamList *params)

{
  bool bVar1;
  reference ppPVar2;
  char *pcVar3;
  long in_RSI;
  string *in_RDI;
  char *decl_str;
  Param *p;
  iterator i;
  int first;
  string *param_decls;
  string *__lhs;
  __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_> local_20;
  int local_18;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_18 = 1;
  if (local_10 != 0) {
    local_20._M_current =
         (Param **)
         std::vector<Param_*,_std::allocator<Param_*>_>::begin
                   ((vector<Param_*,_std::allocator<Param_*>_> *)in_RDI);
    while( true ) {
      std::vector<Param_*,_std::allocator<Param_*>_>::end
                ((vector<Param_*,_std::allocator<Param_*>_> *)in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                          *)__lhs,(__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                                   *)in_RDI);
      if (!bVar1) break;
      ppPVar2 = __gnu_cxx::
                __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
                operator*(&local_20);
      Param::decl_str_abi_cxx11_(*ppPVar2);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      if (local_18 == 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,", ");
      }
      else {
        local_18 = 0;
      }
      std::__cxx11::string::operator+=((string *)in_RDI,pcVar3);
      __gnu_cxx::__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
      operator++(&local_20);
    }
  }
  return __lhs;
}

Assistant:

string ParamDecls(ParamList* params)
	{
	string param_decls;

	int first = 1;
	foreach (i, ParamList, params)
		{
		Param* p = *i;
		const char* decl_str = p->decl_str().c_str();
		if ( first )
			first = 0;
		else
			param_decls += ", ";
		param_decls += decl_str;
		}
	return param_decls;
	}